

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorPool::IsSubSymbolOfBuiltType(DescriptorPool *this,string *name)

{
  pointer pcVar1;
  Tables *pTVar2;
  _Node **pp_Var3;
  ulong uVar4;
  long *__s1;
  _Node *p_Var5;
  char cVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  _Node *p_Var11;
  Symbol *pSVar12;
  long *plVar13;
  string prefix;
  long *local_78 [2];
  long local_68 [2];
  string *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_78[0] = local_68;
  pcVar1 = (name->_M_dataplus)._M_p;
  local_58 = name;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,pcVar1,pcVar1 + name->_M_string_length);
  do {
    lVar9 = std::__cxx11::string::rfind((char)(string *)local_78,0x2e);
    if (lVar9 == -1) {
      cVar6 = '\x02';
    }
    else {
      std::__cxx11::string::substr((ulong)local_50,(ulong)local_78);
      std::__cxx11::string::operator=((string *)local_78,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      __s1 = local_78[0];
      pTVar2 = (this->tables_).ptr_;
      if (pTVar2 == (Tables *)0x0) {
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                      ,0x1e2,
                      "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
                     );
      }
      cVar6 = (char)*local_78[0];
      if (cVar6 == '\0') {
        uVar10 = 0;
      }
      else {
        uVar10 = 0;
        plVar13 = local_78[0];
        do {
          plVar13 = (long *)((long)plVar13 + 1);
          uVar10 = (long)cVar6 + uVar10 * 5;
          cVar6 = *(char *)plVar13;
        } while (cVar6 != '\0');
      }
      pp_Var3 = (pTVar2->symbols_by_name_).
                super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                .
                super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                .
                super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                ._M_buckets;
      uVar4 = (pTVar2->symbols_by_name_).
              super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
              .
              super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
              .
              super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
              ._M_bucket_count;
      p_Var11 = (_Node *)0x0;
      p_Var5 = pp_Var3[uVar10 % uVar4];
      if (pp_Var3[uVar10 % uVar4] != (_Node *)0x0) {
        do {
          p_Var11 = p_Var5;
          iVar8 = strcmp((char *)__s1,(p_Var11->_M_v).first);
          if (iVar8 == 0) goto LAB_001cdcac;
          p_Var5 = p_Var11->_M_next;
        } while (p_Var11->_M_next !=
                 (_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
                  *)0x0);
        p_Var11 = (_Node *)0x0;
      }
LAB_001cdcac:
      if (p_Var11 == (_Node *)0x0) {
        p_Var11 = pp_Var3[uVar4];
      }
      pSVar12 = &(p_Var11->_M_v).second;
      if (p_Var11 == pp_Var3[uVar4]) {
        pSVar12 = (Symbol *)&(anonymous_namespace)::kNullSymbol;
      }
      cVar6 = pSVar12->type != PACKAGE && pSVar12->type != NULL_SYMBOL;
    }
    if (cVar6 != '\0') {
      if (cVar6 == '\x02') {
        if (this->underlay_ == (DescriptorPool *)0x0) {
          bVar7 = false;
        }
        else {
          bVar7 = IsSubSymbolOfBuiltType(this->underlay_,local_58);
        }
      }
      else {
        bVar7 = true;
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      return bVar7;
    }
  } while( true );
}

Assistant:

bool DescriptorPool::IsSubSymbolOfBuiltType(const string& name) const {
  string prefix = name;
  for (;;) {
    string::size_type dot_pos = prefix.find_last_of('.');
    if (dot_pos == string::npos) {
      break;
    }
    prefix = prefix.substr(0, dot_pos);
    Symbol symbol = tables_->FindSymbol(prefix);
    // If the symbol type is anything other than PACKAGE, then its complete
    // definition is already known.
    if (!symbol.IsNull() && symbol.type != Symbol::PACKAGE) {
      return true;
    }
  }
  if (underlay_ != NULL) {
    // Check to see if any prefix of this symbol exists in the underlay.
    return underlay_->IsSubSymbolOfBuiltType(name);
  }
  return false;
}